

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void iadst16_low8_ssse3(__m128i *input,__m128i *output)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  __m128i __rounding_00;
  undefined1 auVar6 [16];
  __m128i __rounding_01;
  undefined1 auVar7 [16];
  __m128i __rounding_02;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  __m128i *in_RSI;
  undefined1 (*in_RDI) [16];
  __m128i _in_7;
  __m128i _w1_7;
  __m128i _w0_7;
  __m128i _in_6;
  __m128i _w1_6;
  __m128i _w0_6;
  __m128i _in_5;
  __m128i _w1_5;
  __m128i _w0_5;
  __m128i _in_4;
  __m128i _w1_4;
  __m128i _w0_4;
  __m128i _in_3;
  __m128i _w1_3;
  __m128i _w0_3;
  __m128i _in_2;
  __m128i _w1_2;
  __m128i _w0_2;
  __m128i _in_1;
  __m128i _w1_1;
  __m128i _w0_1;
  __m128i _in;
  __m128i _w1;
  __m128i _w0;
  __m128i x [16];
  __m128i __rounding;
  int32_t *cospi;
  int8_t cos_bit;
  __m128i *x_00;
  __m128i local_588;
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  undefined1 local_558 [16];
  undefined1 local_548 [16];
  undefined1 local_538 [16];
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined8 local_488;
  undefined8 uStack_480;
  int32_t *local_478;
  undefined1 local_469;
  __m128i *local_468;
  undefined1 (*local_460) [16];
  undefined2 local_458;
  undefined2 local_456;
  undefined2 local_454;
  undefined2 local_452;
  undefined2 local_450;
  undefined2 local_44e;
  undefined2 local_44c;
  undefined2 local_44a;
  short local_448;
  undefined2 local_446;
  short local_444;
  undefined2 local_442;
  short local_440;
  undefined2 local_43e;
  short local_43c;
  undefined2 local_43a;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined7 local_408;
  int8_t cos_bit_00;
  undefined8 uVar20;
  undefined7 uVar21;
  int8_t cos_bit_01;
  longlong lVar22;
  int32_t *cospi_00;
  __m128i *x_01;
  __m128i *x_02;
  int8_t cos_bit_02;
  __m128i *palVar23;
  longlong lVar24;
  __m128i *cospi_01;
  __m128i *x_03;
  
  local_469 = 0xc;
  local_468 = in_RSI;
  local_460 = in_RDI;
  local_478 = cospi_arr(0xc);
  local_488 = 0x80000000800;
  uStack_480 = 0x80000000800;
  pauVar1 = local_460 + 5;
  x_00 = *(__m128i **)*pauVar1;
  x_03 = *(__m128i **)(local_460[5] + 8);
  pauVar2 = local_460 + 3;
  cospi_00 = *(int32_t **)*pauVar2;
  x_01 = *(__m128i **)(local_460[3] + 8);
  pauVar3 = local_460 + 1;
  local_428 = *(undefined8 *)*pauVar3;
  uStack_420 = *(undefined8 *)(local_460[1] + 8);
  local_43a = (undefined2)(local_478[0x3e] << 3);
  auVar19._2_2_ = local_43a;
  auVar19._0_2_ = local_43a;
  auVar19._4_2_ = local_43a;
  auVar19._6_2_ = local_43a;
  auVar19._10_2_ = local_43a;
  auVar19._8_2_ = local_43a;
  auVar19._12_2_ = local_43a;
  auVar19._14_2_ = local_43a;
  local_43c = (short)local_478[2] * -8;
  auVar18._2_2_ = local_43c;
  auVar18._0_2_ = local_43c;
  auVar18._4_2_ = local_43c;
  auVar18._6_2_ = local_43c;
  auVar18._10_2_ = local_43c;
  auVar18._8_2_ = local_43c;
  auVar18._12_2_ = local_43c;
  auVar18._14_2_ = local_43c;
  local_588 = (__m128i)pmulhrsw(*local_460,auVar19);
  local_578 = pmulhrsw(*local_460,auVar18);
  local_43e = (undefined2)(local_478[0x36] << 3);
  auVar17._2_2_ = local_43e;
  auVar17._0_2_ = local_43e;
  auVar17._4_2_ = local_43e;
  auVar17._6_2_ = local_43e;
  auVar17._10_2_ = local_43e;
  auVar17._8_2_ = local_43e;
  auVar17._12_2_ = local_43e;
  auVar17._14_2_ = local_43e;
  local_440 = (short)local_478[10] * -8;
  auVar16._2_2_ = local_440;
  auVar16._0_2_ = local_440;
  auVar16._4_2_ = local_440;
  auVar16._6_2_ = local_440;
  auVar16._10_2_ = local_440;
  auVar16._8_2_ = local_440;
  auVar16._12_2_ = local_440;
  auVar16._14_2_ = local_440;
  local_568 = pmulhrsw(local_460[2],auVar17);
  local_558 = pmulhrsw(local_460[2],auVar16);
  local_442 = (undefined2)(local_478[0x2e] << 3);
  auVar15._2_2_ = local_442;
  auVar15._0_2_ = local_442;
  auVar15._4_2_ = local_442;
  auVar15._6_2_ = local_442;
  auVar15._10_2_ = local_442;
  auVar15._8_2_ = local_442;
  auVar15._12_2_ = local_442;
  auVar15._14_2_ = local_442;
  local_444 = (short)local_478[0x12] * -8;
  auVar14._2_2_ = local_444;
  auVar14._0_2_ = local_444;
  auVar14._4_2_ = local_444;
  auVar14._6_2_ = local_444;
  auVar14._10_2_ = local_444;
  auVar14._8_2_ = local_444;
  auVar14._12_2_ = local_444;
  auVar14._14_2_ = local_444;
  local_548 = pmulhrsw(local_460[4],auVar15);
  local_538 = pmulhrsw(local_460[4],auVar14);
  local_446 = (undefined2)(local_478[0x26] << 3);
  auVar13._2_2_ = local_446;
  auVar13._0_2_ = local_446;
  auVar13._4_2_ = local_446;
  auVar13._6_2_ = local_446;
  auVar13._10_2_ = local_446;
  auVar13._8_2_ = local_446;
  auVar13._12_2_ = local_446;
  auVar13._14_2_ = local_446;
  local_448 = (short)local_478[0x1a] * -8;
  auVar12._2_2_ = local_448;
  auVar12._0_2_ = local_448;
  auVar12._4_2_ = local_448;
  auVar12._6_2_ = local_448;
  auVar12._10_2_ = local_448;
  auVar12._8_2_ = local_448;
  auVar12._12_2_ = local_448;
  auVar12._14_2_ = local_448;
  local_528 = pmulhrsw(local_460[6],auVar13);
  local_518 = pmulhrsw(local_460[6],auVar12);
  local_44a = (undefined2)(local_478[0x22] << 3);
  auVar11._2_2_ = local_44a;
  auVar11._0_2_ = local_44a;
  auVar11._4_2_ = local_44a;
  auVar11._6_2_ = local_44a;
  auVar11._10_2_ = local_44a;
  auVar11._8_2_ = local_44a;
  auVar11._12_2_ = local_44a;
  auVar11._14_2_ = local_44a;
  local_44c = (undefined2)(local_478[0x1e] << 3);
  auVar10._2_2_ = local_44c;
  auVar10._0_2_ = local_44c;
  auVar10._4_2_ = local_44c;
  auVar10._6_2_ = local_44c;
  auVar10._10_2_ = local_44c;
  auVar10._8_2_ = local_44c;
  auVar10._12_2_ = local_44c;
  auVar10._14_2_ = local_44c;
  local_508 = pmulhrsw(local_460[7],auVar11);
  local_4f8 = pmulhrsw(local_460[7],auVar10);
  local_44e = (undefined2)(local_478[0x2a] << 3);
  auVar9._2_2_ = local_44e;
  auVar9._0_2_ = local_44e;
  auVar9._4_2_ = local_44e;
  auVar9._6_2_ = local_44e;
  auVar9._10_2_ = local_44e;
  auVar9._8_2_ = local_44e;
  auVar9._12_2_ = local_44e;
  auVar9._14_2_ = local_44e;
  local_450 = (undefined2)(local_478[0x16] << 3);
  lVar24 = CONCAT26(local_450,CONCAT24(local_450,CONCAT22(local_450,local_450)));
  auVar8._10_2_ = local_450;
  auVar8._8_2_ = local_450;
  auVar8._12_2_ = local_450;
  auVar8._14_2_ = local_450;
  local_4e8 = pmulhrsw(*pauVar1,auVar9);
  auVar8._0_8_ = lVar24;
  local_4d8 = pmulhrsw(*pauVar1,auVar8);
  local_452 = (undefined2)(local_478[0x32] << 3);
  x_02 = (__m128i *)CONCAT26(local_452,CONCAT24(local_452,CONCAT22(local_452,local_452)));
  auVar7._10_2_ = local_452;
  auVar7._8_2_ = local_452;
  auVar7._12_2_ = local_452;
  auVar7._14_2_ = local_452;
  local_454 = (undefined2)(local_478[0xe] << 3);
  lVar22 = CONCAT26(local_454,CONCAT24(local_454,CONCAT22(local_454,local_454)));
  cos_bit_02 = (int8_t)((ulong)cospi_00 >> 0x38);
  auVar7._0_8_ = x_02;
  local_4c8 = pmulhrsw(*pauVar2,auVar7);
  uVar21 = (undefined7)CONCAT26(local_454,CONCAT24(local_454,CONCAT22(local_454,local_454)));
  cos_bit_01 = (int8_t)((uint)(local_478[0xe] << 3) >> 8);
  auVar6[7] = cos_bit_01;
  auVar6._0_7_ = uVar21;
  auVar6._8_8_ = lVar22;
  local_4b8 = pmulhrsw(*pauVar2,auVar6);
  local_456 = (undefined2)(local_478[0x3a] << 3);
  local_418 = CONCAT26(local_456,CONCAT24(local_456,CONCAT22(local_456,local_456)));
  uStack_410 = CONCAT26(local_456,CONCAT24(local_456,CONCAT22(local_456,local_456)));
  local_458 = (undefined2)(local_478[6] << 3);
  local_438 = CONCAT26(local_458,CONCAT24(local_458,CONCAT22(local_458,local_458)));
  uStack_430 = CONCAT26(local_458,CONCAT24(local_458,CONCAT22(local_458,local_458)));
  local_408 = (undefined7)local_428;
  cos_bit_00 = (int8_t)((ulong)local_428 >> 0x38);
  auVar5._8_8_ = uStack_410;
  auVar5._0_8_ = local_418;
  local_4a8 = pmulhrsw(*pauVar3,auVar5);
  auVar4._8_8_ = uStack_430;
  auVar4._0_8_ = local_438;
  local_498 = pmulhrsw(*pauVar3,auVar4);
  uVar20 = uStack_420;
  palVar23 = x_01;
  cospi_01 = x_00;
  iadst16_stage3_ssse3(x_00);
  __rounding_02[1] = lVar24;
  __rounding_02[0] = (longlong)palVar23;
  iadst16_stage4_ssse3(x_03,(int32_t *)cospi_01,__rounding_02,cos_bit_02);
  iadst16_stage5_ssse3(x_00);
  __rounding_01[1] = (longlong)cospi_00;
  __rounding_01[0] = lVar22;
  iadst16_stage6_ssse3(x_02,(int32_t *)x_01,__rounding_01,cos_bit_01);
  iadst16_stage7_ssse3(x_00);
  __rounding_00[1]._0_7_ = uVar21;
  __rounding_00[0] = uVar20;
  __rounding_00[1]._7_1_ = cos_bit_01;
  iadst16_stage8_ssse3(x_01,cospi_00,__rounding_00,cos_bit_00);
  iadst16_stage9_ssse3(local_468,&local_588);
  return;
}

Assistant:

static void iadst16_low8_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  // stage 1
  __m128i x[16];
  x[1] = input[0];
  x[3] = input[2];
  x[5] = input[4];
  x[7] = input[6];
  x[8] = input[7];
  x[10] = input[5];
  x[12] = input[3];
  x[14] = input[1];

  // stage 2
  btf_16_ssse3(cospi[62], -cospi[2], x[1], x[0], x[1]);
  btf_16_ssse3(cospi[54], -cospi[10], x[3], x[2], x[3]);
  btf_16_ssse3(cospi[46], -cospi[18], x[5], x[4], x[5]);
  btf_16_ssse3(cospi[38], -cospi[26], x[7], x[6], x[7]);
  btf_16_ssse3(cospi[34], cospi[30], x[8], x[8], x[9]);
  btf_16_ssse3(cospi[42], cospi[22], x[10], x[10], x[11]);
  btf_16_ssse3(cospi[50], cospi[14], x[12], x[12], x[13]);
  btf_16_ssse3(cospi[58], cospi[6], x[14], x[14], x[15]);

  // stage 3
  iadst16_stage3_ssse3(x);
  iadst16_stage4_ssse3(x, cospi, __rounding, cos_bit);
  iadst16_stage5_ssse3(x);
  iadst16_stage6_ssse3(x, cospi, __rounding, cos_bit);
  iadst16_stage7_ssse3(x);
  iadst16_stage8_ssse3(x, cospi, __rounding, cos_bit);
  iadst16_stage9_ssse3(output, x);
}